

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O3

SockAddr * sk_nonamelookup(char *host)

{
  SockAddr *pSVar1;
  
  pSVar1 = (SockAddr *)safemalloc(1,0x220,0);
  pSVar1->error = (char *)0x0;
  pSVar1->superfamily = UNRESOLVED;
  strncpy(pSVar1->hostname,host,0x200);
  pSVar1->hostname[0x1ff] = '\0';
  pSVar1->ais = (addrinfo *)0x0;
  pSVar1->refcount = 1;
  return pSVar1;
}

Assistant:

SockAddr *sk_nonamelookup(const char *host)
{
    SockAddr *ret = snew(SockAddr);
    ret->error = NULL;
    ret->superfamily = UNRESOLVED;
    strncpy(ret->hostname, host, lenof(ret->hostname));
    ret->hostname[lenof(ret->hostname)-1] = '\0';
#ifndef NO_IPV6
    ret->ais = NULL;
#else
    ret->addresses = NULL;
#endif
    ret->refcount = 1;
    return ret;
}